

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

bool __thiscall ThreadContext::DoRedeferFunctionBodies(ThreadContext *this)

{
  RedeferralState RVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->TTDLog == (EventLog *)0x0) {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,RedeferralPhase);
    if (bVar3) {
      return true;
    }
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b30e0,RedeferralPhase);
    if (bVar3) {
      return true;
    }
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,RedeferralPhase);
    if ((!bVar3) && (RVar1 = this->redeferralState, RVar1 != InitialRedeferralState)) {
      if (RVar1 == MainRedeferralState) {
        bVar3 = this->gcSinceLastRedeferral < 0x14;
      }
      else {
        if (RVar1 != StartupRedeferralState) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                             ,0xac7,"(0)","0");
          if (bVar3) {
            *puVar4 = 0;
            return false;
          }
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        bVar3 = this->gcSinceLastRedeferral < 10;
      }
      return !bVar3;
    }
  }
  return false;
}

Assistant:

bool
ThreadContext::DoRedeferFunctionBodies() const
{
#if ENABLE_TTD
    if (this->IsRuntimeInTTDMode())
    {
        return false;
    }
#endif

    if (PHASE_FORCE1(Js::RedeferralPhase) || PHASE_STRESS1(Js::RedeferralPhase))
    {
        return true;
    }

    if (PHASE_OFF1(Js::RedeferralPhase))
    {
        return false;
    }

    switch (this->redeferralState)
    {
        case InitialRedeferralState:
            return false;

        case StartupRedeferralState:
            return gcSinceLastRedeferral >= StartupRedeferralCheckInterval;

        case MainRedeferralState:
            return gcSinceLastRedeferral >= MainRedeferralCheckInterval;

        default:
            Assert(0);
            return false;
    };
}